

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  char *pcVar1;
  byte *__nptr;
  byte bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  long lVar8;
  size_t sVar9;
  undefined1 *puVar10;
  undefined8 *puVar11;
  int *piVar12;
  double *pdVar13;
  ulong uVar14;
  double dVar15;
  char *pcVar16;
  double dVar17;
  double dVar18;
  long lVar19;
  int iVar20;
  uint *puVar21;
  double dVar22;
  uint uVar23;
  long lVar24;
  byte *pbVar25;
  char **unaff_R13;
  long lVar26;
  uint uVar27;
  size_t maxlength;
  bool bVar28;
  char formatbuf [32];
  char work [326];
  va_stack_t vto [128];
  char *endpos [128];
  int local_1600;
  undefined8 *local_15e8;
  char **local_15e0;
  char *local_15d8;
  __va_list_tag *local_15d0;
  double local_15c8;
  double local_15c0;
  char *local_15b8;
  char *local_15b0;
  undefined8 local_15a8;
  undefined8 uStack_15a0;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined1 local_1444;
  undefined1 local_1443 [11];
  int local_1438;
  undefined4 uStack_1434;
  undefined1 local_1430 [8];
  undefined8 local_1428;
  double local_1420 [509];
  undefined8 local_438 [129];
  
  bVar2 = *format;
  iVar20 = 0;
  local_15b8 = format;
  if (bVar2 != 0) {
    puVar11 = local_438;
    unaff_R13 = (char **)&local_1588;
    dVar15 = 0.0;
LAB_00102470:
    pbVar25 = (byte *)format + 1;
    while (local_1588 = pbVar25, bVar2 == 0x25) {
      if (*local_1588 != 0x25) {
        iVar20 = iVar20 + 1;
        local_15d0 = ap_save;
        dVar22 = (double)dprintf_DollarString((char *)local_1588,unaff_R13);
        dVar17 = (double)(long)iVar20;
        if (dVar22 != 0.0) {
          dVar17 = dVar22;
        }
        if ((long)dVar15 < (long)dVar17) {
          dVar15 = dVar17;
        }
        dVar22 = 0.0;
        local_15c8 = 0.0;
        uVar27 = 0;
        pbVar25 = local_1588;
        goto switchD_00102525_caseD_1;
      }
      bVar2 = local_1588[1];
      pbVar25 = local_1588 + 2;
      if (bVar2 == 0) {
        format = (char *)(local_1588 + 1);
        goto LAB_00102985;
      }
    }
    goto LAB_00102967;
  }
  dVar15 = 0.0;
LAB_00102985:
  if (0 < (long)dVar15) {
    pdVar7 = local_1420;
    do {
      if (((ulong)*pdVar7 & 0x400000000000) != 0) {
        uVar27 = ap_save->gp_offset;
        if ((ulong)uVar27 < 0x29) {
          piVar12 = (int *)((ulong)uVar27 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar27 + 8;
        }
        else {
          piVar12 = (int *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = piVar12 + 2;
        }
        local_1420[(long)pdVar7[-2] * 4] = (double)(long)*piVar12;
      }
      if (((ulong)*pdVar7 & 0x1000000000000) != 0) {
        uVar27 = ap_save->gp_offset;
        if ((ulong)uVar27 < 0x29) {
          piVar12 = (int *)((ulong)uVar27 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar27 + 8;
        }
        else {
          piVar12 = (int *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = piVar12 + 2;
        }
        local_1420[(long)pdVar7[-1] * 4] = (double)(long)*piVar12;
      }
      switch(*(undefined4 *)(pdVar7 + -3)) {
      case 0:
      case 1:
      case 2:
      case 4:
switchD_00102a2f_caseD_0:
        uVar27 = ap_save->gp_offset;
        if ((ulong)uVar27 < 0x29) {
          pdVar13 = (double *)((ulong)uVar27 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar27 + 8;
        }
        else {
          pdVar13 = (double *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = pdVar13 + 1;
        }
        dVar17 = *pdVar13;
        goto LAB_00102a56;
      case 3:
        uVar27 = *(uint *)((long)pdVar7 + -0x14);
        if ((((~uVar27 & 0x240) == 0) || ((uVar27 & 0x40) != 0)) || ((~uVar27 & 0x220) == 0))
        goto switchD_00102a2f_caseD_0;
        uVar23 = ap_save->gp_offset;
        uVar14 = (ulong)uVar23;
        if ((uVar27 & 0x20) == 0) {
          if ((uVar27 >> 9 & 1) == 0) {
            if (uVar23 < 0x29) {
              piVar12 = (int *)(uVar14 + (long)ap_save->reg_save_area);
              ap_save->gp_offset = uVar23 + 8;
            }
            else {
              piVar12 = (int *)ap_save->overflow_arg_area;
              ap_save->overflow_arg_area = piVar12 + 2;
            }
            dVar17 = (double)(long)*piVar12;
          }
          else {
            if (uVar23 < 0x29) {
              puVar21 = (uint *)(uVar14 + (long)ap_save->reg_save_area);
              ap_save->gp_offset = uVar23 + 8;
            }
            else {
              puVar21 = (uint *)ap_save->overflow_arg_area;
              ap_save->overflow_arg_area = puVar21 + 2;
            }
            dVar17 = (double)(ulong)*puVar21;
          }
        }
        else {
          if (uVar23 < 0x29) {
            pdVar13 = (double *)((long)ap_save->reg_save_area + uVar14);
            ap_save->gp_offset = uVar23 + 8;
          }
          else {
            pdVar13 = (double *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = pdVar13 + 1;
          }
          dVar17 = *pdVar13;
        }
LAB_00102a56:
        *pdVar7 = dVar17;
        break;
      case 7:
        uVar27 = ap_save->fp_offset;
        if ((ulong)uVar27 < 0xa1) {
          pdVar13 = (double *)((ulong)uVar27 + (long)ap_save->reg_save_area);
          ap_save->fp_offset = uVar27 + 0x10;
        }
        else {
          pdVar13 = (double *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = pdVar13 + 1;
        }
        *pdVar7 = *pdVar13;
        break;
      case 9:
        *(undefined4 *)(pdVar7 + -3) = 3;
      }
      pdVar7 = pdVar7 + 4;
      dVar15 = (double)((long)dVar15 + -1);
    } while (dVar15 != 0.0);
  }
  local_15e8 = local_438;
  local_15c8 = 0.0;
  iVar20 = 0;
  local_15b0 = "0123456789abcdefghijklmnopqrstuvwxyz";
  local_15d8 = local_15b8;
  local_15b8 = (char *)local_15e8;
  local_1588 = (byte *)format;
LAB_00102b78:
  if (*local_15d8 != '%') {
    pcVar16 = local_15d8;
    if (*local_15d8 == '\0') {
      return iVar20;
    }
    do {
      iVar4 = (*stream)((int)*pcVar16,(FILE *)data);
      if (iVar4 == -1) {
        uVar27 = 1;
        local_15d8 = pcVar16;
        local_1600 = iVar20;
        goto LAB_00103459;
      }
      iVar20 = iVar20 + 1;
      pcVar1 = pcVar16 + 1;
      pcVar16 = pcVar16 + 1;
    } while ((*pcVar1 != '\0') && (*pcVar1 != '%'));
    uVar27 = 0;
    local_15d8 = pcVar16;
    goto LAB_00103459;
  }
  pcVar16 = local_15d8 + 1;
  if (local_15d8[1] == '%') {
    local_15d8 = local_15d8 + 2;
    iVar4 = (*stream)(0x25,(FILE *)data);
    if (iVar4 == -1) {
LAB_00102e99:
      uVar27 = 1;
      local_1600 = iVar20;
    }
    else {
      uVar27 = 0;
      iVar20 = iVar20 + 1;
    }
    goto LAB_00103459;
  }
  local_15d8 = pcVar16;
  lVar8 = dprintf_DollarString(pcVar16,&local_15d8);
  dVar15 = (double)(lVar8 + -1);
  if (lVar8 == 0) {
    dVar15 = local_15c8;
  }
  lVar8 = (long)dVar15 * 0x20;
  if (((uint)(&uStack_1434)[(long)dVar15 * 8] >> 0xe & 1) == 0) {
    local_15c8 = (double)((long)local_15c8 + 1);
    dVar17 = *(double *)(local_1430 + lVar8);
  }
  else {
    dVar17 = local_1420[*(long *)(local_1430 + lVar8) * 4];
    local_15c8 = (double)((long)local_15c8 + 2);
    if ((long)dVar17 < 0) {
      dVar17 = (double)-(long)dVar17;
      (&uStack_1434)[(long)dVar15 * 8] = (&uStack_1434)[(long)dVar15 * 8] & 0xfffffefb | 4;
    }
  }
  uVar27 = (&uStack_1434)[(long)dVar15 * 8];
  if ((uVar27 >> 0x10 & 1) == 0) {
    dVar22 = -NAN;
    if ((short)uVar27 < 0) {
      dVar22 = local_1420[(long)dVar15 * 4 + -1];
    }
  }
  else {
    dVar22 = local_1420[(long)local_1420[(long)dVar15 * 4 + -1] * 4];
    local_15c8 = (double)((long)local_15c8 + 1);
    if ((long)dVar22 < 0) {
      dVar22 = -NAN;
    }
  }
  if (6 < (&local_1438)[(long)dVar15 * 8] - 1U) goto switchD_00102cd9_caseD_5;
  uVar23 = uVar27 >> 3 & 1;
  iVar5 = SUB84(dVar17,0);
  iVar4 = local_1600;
  switch((&local_1438)[(long)dVar15 * 8]) {
  case 1:
    local_15d0 = (__va_list_tag *)local_1420[(long)dVar15 * 4];
    if (local_15d0 == (__va_list_tag *)0x0) {
      if (dVar22 == -NAN || 4 < (long)dVar22) {
        (&uStack_1434)[(long)dVar15 * 8] = uVar27 & 0xfffffff7;
        dVar22 = 2.47032822920623e-323;
        local_15d0 = (__va_list_tag *)0x107114;
      }
      else {
        local_15d0 = (__va_list_tag *)0x10752b;
        dVar22 = 0.0;
      }
    }
    else if (dVar22 == -NAN) {
      dVar22 = (double)strlen((char *)local_15d0);
    }
    dVar18 = NAN;
    if ((ulong)dVar22 < 0x7fffffffffffffff) {
      dVar18 = dVar22;
    }
    if ((*(byte *)(&uStack_1434 + (long)dVar15 * 8) & 8) != 0) {
      iVar6 = (*stream)(0x22,(FILE *)data);
      if (iVar6 == -1) {
LAB_00103274:
        bVar28 = false;
        iVar4 = iVar20;
        break;
      }
      iVar20 = iVar20 + 1;
    }
    lVar8 = (long)dVar17 - (long)dVar18;
    if ((*(byte *)(&uStack_1434 + (long)dVar15 * 8) & 4) == 0) {
      if (lVar8 < 1) {
        lVar8 = lVar8 + -1;
      }
      else {
        iVar5 = iVar5 + iVar20;
        do {
          iVar6 = (*stream)(0x20,(FILE *)data);
          if (iVar6 == -1) goto LAB_00103274;
          iVar20 = iVar20 + 1;
          lVar24 = lVar8 + -1;
          bVar28 = 0 < lVar8;
          lVar8 = lVar24;
        } while (lVar24 != 0 && bVar28);
        lVar8 = -1;
        iVar20 = iVar5 - SUB84(dVar18,0);
      }
    }
    if (dVar22 != 0.0) {
      dVar17 = 0.0;
      do {
        cVar3 = *(char *)((long)&local_15d0->gp_offset + (long)dVar17);
        iVar5 = SUB84(dVar17,0);
        if (cVar3 == '\0') break;
        iVar5 = (*stream)((int)cVar3,(FILE *)data);
        if (iVar5 == -1) {
          iVar20 = iVar20 + SUB84(dVar17,0);
          goto LAB_00103274;
        }
        dVar17 = (double)((long)dVar17 + 1);
        iVar5 = SUB84(dVar22,0);
      } while (dVar22 != dVar17);
      iVar20 = iVar5 + iVar20;
    }
    if (((*(byte *)(&uStack_1434 + (long)dVar15 * 8) & 4) != 0) && (0 < lVar8)) {
      iVar6 = (int)lVar8 + iVar20;
      lVar8 = lVar8 + 1;
      iVar5 = iVar20;
      do {
        iVar20 = iVar5;
        iVar5 = (*stream)(0x20,(FILE *)data);
        if (iVar5 == -1) goto LAB_0010325d;
        iVar5 = iVar20 + 1;
        lVar8 = lVar8 + -1;
        iVar20 = iVar6;
      } while (1 < lVar8);
    }
    bVar28 = true;
    if ((*(byte *)(&uStack_1434 + (long)dVar15 * 8) & 8) != 0) {
      iVar5 = (*stream)(0x22,(FILE *)data);
      if (iVar5 == -1) {
LAB_0010325d:
        bVar28 = false;
        iVar4 = iVar20;
      }
      else {
        iVar20 = iVar20 + 1;
      }
    }
    break;
  case 2:
    if ((char **)local_1420[(long)dVar15 * 4] == (char **)0x0) {
      local_15c0 = dVar22;
      if ((uVar27 & 4) == 0) {
        dVar17 = (double)((long)dVar17 + -5);
      }
      else {
        dVar22 = (double)((long)dVar17 + -6);
        bVar28 = 5 < (long)dVar17;
        dVar17 = dVar22;
        if (bVar28) {
          iVar5 = iVar5 + iVar20;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            if (iVar4 == -1) goto LAB_001033c0;
            iVar20 = iVar20 + 1;
            bVar28 = 0 < (long)dVar17;
            dVar17 = (double)((long)dVar17 + -1);
          } while (bVar28);
          dVar17 = -NAN;
          iVar20 = iVar5 + -5;
        }
      }
      iVar4 = iVar20 + 5;
      cVar3 = '(';
      lVar24 = 0;
LAB_00103336:
      iVar5 = (*stream)((int)cVar3,(FILE *)data);
      if (iVar5 != -1) goto code_r0x00103346;
      iVar20 = iVar20 + (int)lVar24;
LAB_001033c0:
      uVar27 = 1;
      dVar22 = local_15c0;
      iVar4 = iVar20;
      local_1600 = iVar20;
      goto LAB_001033de;
    }
    local_15b0 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
    if ((uVar27 >> 0xc & 1) == 0) {
      local_15b0 = "0123456789abcdefghijklmnopqrstuvwxyz";
    }
    local_15e0 = (char **)0x10;
    local_15e8 = (undefined8 *)0x0;
    uVar23 = 1;
    uVar27 = 0x16;
    unaff_R13 = (char **)local_1420[(long)dVar15 * 4];
    iVar4 = iVar20;
    goto LAB_001033de;
  case 3:
    unaff_R13 = (char **)local_1420[(long)dVar15 * 4];
    if ((uVar27 >> 0x11 & 1) == 0) {
      local_15e0 = (char **)0x8;
      local_15e8 = (undefined8 *)0x0;
      if ((uVar27 >> 10 & 1) == 0) {
        if ((uVar27 >> 0xb & 1) == 0) {
          local_15e0 = (char **)0xa;
          if ((uVar27 >> 9 & 1) == 0) {
            local_15e8 = (undefined8 *)((ulong)unaff_R13 >> 0x3f);
            if ((long)unaff_R13 < 1) {
              unaff_R13 = (char **)-(long)unaff_R13;
            }
          }
        }
        else {
          local_15b0 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
          if ((uVar27 >> 0xc & 1) == 0) {
            local_15b0 = "0123456789abcdefghijklmnopqrstuvwxyz";
          }
          local_15e0 = (char **)0x10;
        }
      }
      goto LAB_001033e9;
    }
    if ((uVar27 & 4) == 0) {
      if ((long)dVar17 < 2) {
        dVar17 = (double)((long)dVar17 + -1);
      }
      else {
        iVar5 = iVar5 + iVar20;
        do {
          iVar4 = (*stream)(0x20,(FILE *)data);
          if (iVar4 == -1) goto LAB_00102e99;
          iVar20 = iVar20 + 1;
          dVar17 = (double)((long)dVar17 + -1);
        } while (1 < (long)dVar17);
        dVar17 = 0.0;
        iVar20 = iVar5 + -1;
      }
    }
    iVar4 = (*stream)((uint)unaff_R13 & 0xff,(FILE *)data);
    if (iVar4 == -1) goto LAB_00102e99;
    iVar5 = iVar20 + 1;
    iVar4 = iVar5;
    if (((*(byte *)(&uStack_1434 + (long)dVar15 * 8) & 4) != 0) && (1 < (long)dVar17)) {
      iVar4 = iVar20 + SUB84(dVar17,0);
      lVar8 = (long)dVar17 + 1;
      do {
        iVar20 = (*stream)(0x20,(FILE *)data);
        if (iVar20 == -1) goto LAB_00103600;
        iVar5 = iVar5 + 1;
        lVar8 = lVar8 + -1;
      } while (2 < lVar8);
    }
    goto LAB_0010343c;
  case 4:
    if ((uVar27 & 0x40) == 0) {
      iVar4 = iVar20;
      if ((uVar27 & 0x20) == 0) {
        if ((uVar27 & 0x10) == 0) {
          *(int *)local_1420[(long)dVar15 * 4] = iVar20;
        }
        else {
          *(short *)local_1420[(long)dVar15 * 4] = (short)iVar20;
        }
      }
      else {
        *(long *)local_1420[(long)dVar15 * 4] = (long)iVar20;
      }
      goto LAB_0010343c;
    }
    *(long *)local_1420[(long)dVar15 * 4] = (long)iVar20;
  default:
    goto switchD_00102cd9_caseD_5;
  case 7:
    local_1598 = 0;
    uStack_1590 = 0;
    local_15a8 = 0x25;
    uStack_15a0 = 0;
    sVar9 = strlen((char *)&local_15a8);
    if ((uVar27 >> 0xd & 1) == 0) {
      dVar17 = -NAN;
      if ((uVar27 >> 0xe & 1) != 0) {
        pdVar7 = local_1420 + *(long *)(local_1430 + lVar8) * 4;
        goto LAB_00102eba;
      }
    }
    else {
      pdVar7 = (double *)(local_1430 + lVar8);
LAB_00102eba:
      dVar17 = *pdVar7;
    }
    if ((short)uVar27 < 0) {
      dVar22 = local_1420[(long)dVar15 * 4 + -1];
    }
    else {
      dVar22 = -NAN;
      if ((uVar27 >> 0x10 & 1) != 0) {
        dVar22 = local_1420[(long)local_1420[(long)dVar15 * 4 + -1] * 4];
      }
    }
    pbVar25 = (byte *)((long)&local_15a8 + 1);
    if ((uVar27 & 4) != 0) {
      local_15a8._0_2_ = CONCAT11(0x2d,(char)local_15a8);
      pbVar25 = (byte *)((long)&local_15a8 + 2);
    }
    if ((uVar27 & 2) != 0) {
      *pbVar25 = 0x2b;
      pbVar25 = pbVar25 + 1;
    }
    if ((uVar27 & 1) != 0) {
      *pbVar25 = 0x20;
      pbVar25 = pbVar25 + 1;
    }
    if ((*(byte *)(&uStack_1434 + (long)dVar15 * 8) & 8) != 0) {
      *pbVar25 = 0x23;
      pbVar25 = pbVar25 + 1;
    }
    maxlength = 0x20 - sVar9;
    *pbVar25 = 0;
    if (-1 < (long)dVar17) {
      if (0x144 < (long)dVar17) {
        dVar17 = 1.60571334898405e-321;
      }
      iVar5 = curl_msnprintf((char *)pbVar25,maxlength,"%ld",dVar17);
      pbVar25 = pbVar25 + iVar5;
      maxlength = maxlength - (long)iVar5;
    }
    if (-1 < (long)dVar22) {
      lVar8 = 0x144;
      for (dVar17 = local_1420[(long)dVar15 * 4]; 10.0 <= dVar17; dVar17 = dVar17 / 10.0) {
        lVar8 = lVar8 + -1;
      }
      dVar17 = (double)(lVar8 + -1);
      if ((long)dVar22 <= lVar8) {
        dVar17 = dVar22;
      }
      iVar5 = curl_msnprintf((char *)pbVar25,maxlength,".%ld",dVar17);
      pbVar25 = pbVar25 + iVar5;
    }
    if ((*(byte *)(&uStack_1434 + (long)dVar15 * 8) & 0x20) != 0) {
      *pbVar25 = 0x6c;
      pbVar25 = pbVar25 + 1;
    }
    uVar27 = (&uStack_1434)[(long)dVar15 * 8];
    if ((uVar27 >> 0x12 & 1) == 0) {
      bVar2 = 0x66;
      if ((uVar27 >> 0x13 & 1) != 0) {
        bVar2 = ((uVar27 >> 0xc & 1) == 0) << 5 | 0x47;
      }
    }
    else {
      bVar2 = ((uVar27 >> 0xc & 1) == 0) << 5 | 0x45;
    }
    *pbVar25 = bVar2;
    pbVar25[1] = 0;
    sprintf((char *)&local_1588,(char *)&local_15a8,SUB84(local_1420[(long)dVar15 * 4],0));
    bVar28 = (char)local_1588 == '\0';
    if (!bVar28) {
      iVar5 = (*stream)((uint)local_1588 & 0xff,(FILE *)data);
      pcVar16 = (char *)((long)&local_1588 + 1);
      while (iVar4 = iVar20, iVar5 != -1) {
        iVar20 = iVar20 + 1;
        bVar28 = *pcVar16 == '\0';
        iVar4 = local_1600;
        if (bVar28) break;
        iVar5 = (*stream)((int)*pcVar16,(FILE *)data);
        pcVar16 = pcVar16 + 1;
      }
    }
  }
  local_1600 = iVar4;
  uVar27 = 1;
  iVar4 = iVar20;
  if (bVar28) goto LAB_0010343c;
  goto LAB_00103459;
switchD_00102525_caseD_1:
  local_1588 = pbVar25;
  __nptr = local_1588;
  bVar2 = *local_1588;
  uVar23 = bVar2 - 0x20;
  if (((0x2f < uVar23) || ((0x900003ff6c09U >> ((ulong)uVar23 & 0x3f) & 1) == 0)) &&
     ((0x12 < bVar2 - 0x68 || ((0x40211U >> (bVar2 - 0x68 & 0x1f) & 1) == 0)))) goto LAB_001026ad;
  pbVar25 = local_1588 + 1;
  if (bVar2 < 0x4c) {
    switch((ulong)uVar23) {
    case 0:
      uVar27 = uVar27 | 1;
      break;
    case 3:
      uVar27 = uVar27 | 8;
      break;
    case 10:
      uVar27 = uVar27 | 0x4000;
      iVar20 = iVar20 + 1;
      local_1588 = pbVar25;
      dVar18 = (double)dprintf_DollarString((char *)pbVar25,unaff_R13);
      dVar22 = (double)(long)iVar20;
      if (dVar18 != 0.0) {
        dVar22 = dVar18;
      }
      pbVar25 = local_1588;
      if ((long)dVar15 < (long)dVar22) {
        dVar15 = dVar22;
      }
      break;
    case 0xb:
      uVar27 = uVar27 | 2;
      break;
    case 0xd:
      uVar27 = uVar27 & 0xfffffefb | 4;
      break;
    case 0xe:
      if (*pbVar25 == 0x2a) {
        uVar27 = uVar27 | 0x10000;
        local_1588 = local_1588 + 2;
        iVar20 = iVar20 + 1;
        dVar18 = (double)dprintf_DollarString((char *)local_1588,unaff_R13);
        local_15c8 = (double)(long)iVar20;
        if (dVar18 != 0.0) {
          local_15c8 = dVar18;
        }
        pbVar25 = local_1588;
        if ((long)dVar15 < (long)local_15c8) {
          dVar15 = local_15c8;
        }
      }
      else {
        uVar27 = uVar27 | 0x8000;
        local_1588 = pbVar25;
        local_15c8 = (double)strtol((char *)pbVar25,unaff_R13,10);
        pbVar25 = local_1588;
      }
      break;
    case 0x10:
      uVar27 = uVar27 | (~uVar27 & 4) << 6;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      uVar27 = uVar27 | 0x2000;
      local_1588 = pbVar25;
      dVar22 = (double)strtol((char *)__nptr,unaff_R13,10);
      pbVar25 = local_1588;
    }
  }
  else if (bVar2 < 0x6c) {
    if (bVar2 == 0x4c) {
      uVar27 = uVar27 | 0x80;
    }
    else if (bVar2 == 0x4f) {
LAB_0010267a:
      uVar27 = uVar27 | 0x20;
    }
    else if (bVar2 == 0x68) {
      uVar27 = uVar27 | 0x10;
    }
  }
  else {
    if (bVar2 == 0x6c) {
      if ((uVar27 & 0x20) != 0) goto LAB_00102683;
      goto LAB_0010267a;
    }
    if (bVar2 == 0x71) {
LAB_00102683:
      uVar27 = uVar27 | 0x40;
    }
    else if (bVar2 == 0x7a) goto LAB_0010267a;
  }
  goto switchD_00102525_caseD_1;
LAB_001026ad:
  if ((long)dVar17 - 0x81U < 0xffffffffffffff80) {
    return -1;
  }
  lVar8 = (long)dVar17 + -1;
  if (0x57 < bVar2) {
    switch(bVar2) {
    case 99:
      (&local_1438)[lVar8 * 8] = 3;
      uVar27 = uVar27 | 0x20000;
      break;
    case 100:
    case 0x69:
      (&local_1438)[lVar8 * 8] = 3;
      break;
    case 0x65:
      (&local_1438)[lVar8 * 8] = 7;
      uVar27 = uVar27 | 0x40000;
      break;
    case 0x66:
      (&local_1438)[lVar8 * 8] = 7;
      break;
    case 0x67:
      (&local_1438)[lVar8 * 8] = 7;
      uVar27 = uVar27 | 0x80000;
      break;
    case 0x6e:
      (&local_1438)[lVar8 * 8] = 4;
      break;
    case 0x6f:
      (&local_1438)[lVar8 * 8] = 3;
      uVar27 = uVar27 | 0x400;
      break;
    case 0x70:
      (&local_1438)[lVar8 * 8] = 2;
      break;
    case 0x73:
switchD_001026ee_caseD_73:
      (&local_1438)[lVar8 * 8] = 1;
      break;
    case 0x75:
      (&local_1438)[lVar8 * 8] = 3;
      uVar27 = uVar27 | 0x200;
      break;
    case 0x78:
      (&local_1438)[lVar8 * 8] = 3;
      uVar27 = uVar27 | 0xa00;
      break;
    default:
      if (bVar2 == 0x58) {
        (&local_1438)[lVar8 * 8] = 3;
        uVar27 = uVar27 | 0x1a00;
        break;
      }
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
switchD_001026ee_caseD_68:
      (&local_1438)[lVar8 * 8] = 0;
    }
LAB_001028c5:
    (&uStack_1434)[lVar8 * 8] = uVar27;
    *(double *)(local_1430 + lVar8 * 0x20) = dVar22;
    local_1420[lVar8 * 4 + -1] = local_15c8;
    if ((uVar27 >> 0xe & 1) != 0) {
      lVar24 = (long)dVar22 + -1;
      *(long *)(local_1430 + lVar8 * 0x20) = lVar24;
      (&local_1438)[lVar24 * 8] = 9;
      *(undefined8 *)(&uStack_1434 + lVar24 * 8) = 0;
      *(undefined8 *)(local_1430 + lVar24 * 0x20 + 4) = 0;
      *(undefined4 *)((long)local_1420 + lVar24 * 0x20 + -4) = 0;
    }
    if ((uVar27 >> 0x10 & 1) != 0) {
      dVar17 = (double)((long)local_15c8 + -1);
      local_1420[lVar8 * 4 + -1] = dVar17;
      (&local_1438)[(long)dVar17 * 8] = 9;
      *(undefined8 *)(&uStack_1434 + (long)dVar17 * 8) = 0;
      *(undefined8 *)(local_1430 + (long)dVar17 * 0x20 + 4) = 0;
      *(undefined4 *)((long)local_1420 + (long)dVar17 * 0x20 + -4) = 0;
    }
    *puVar11 = local_1588 + 1;
    puVar11 = puVar11 + 1;
    ap_save = local_15d0;
    local_1600 = iVar20;
LAB_00102967:
    bVar2 = *local_1588;
    format = (char *)local_1588;
    if (bVar2 == 0) goto LAB_00102985;
    goto LAB_00102470;
  }
  if (bVar2 == 0x45) {
    (&local_1438)[lVar8 * 8] = 7;
    uVar27 = uVar27 | 0x41000;
    goto LAB_001028c5;
  }
  if (bVar2 == 0x47) {
    (&local_1438)[lVar8 * 8] = 7;
    uVar27 = uVar27 | 0x81000;
    goto LAB_001028c5;
  }
  if (bVar2 == 0x53) {
    uVar27 = uVar27 | 8;
    goto switchD_001026ee_caseD_73;
  }
  goto switchD_001026ee_caseD_68;
code_r0x00103346:
  cVar3 = "(nil)"[lVar24 + 1];
  lVar24 = lVar24 + 1;
  if (lVar24 == 5) goto code_r0x0010335b;
  goto LAB_00103336;
code_r0x0010335b:
  uVar27 = 0;
  dVar22 = local_15c0;
  if ((*(byte *)(&uStack_1434 + (long)dVar15 * 8) & 4) == 0) {
    if ((long)dVar17 < 1) {
      dVar17 = (double)((long)dVar17 + -1);
    }
    else {
      iVar5 = SUB84(dVar17,0);
      do {
        iVar6 = (*stream)(0x20,(FILE *)data);
        dVar22 = local_15c0;
        if (iVar6 == -1) {
          dVar17 = (double)((long)dVar17 + -1);
          uVar27 = 1;
          local_1600 = iVar4;
          goto LAB_001033de;
        }
        iVar4 = iVar4 + 1;
        dVar18 = (double)((long)dVar17 + -1);
        bVar28 = 0 < (long)dVar17;
        dVar17 = dVar18;
      } while (dVar18 != 0.0 && bVar28);
      dVar17 = -NAN;
      iVar4 = iVar20 + iVar5 + 5;
    }
  }
LAB_001033de:
  iVar20 = iVar4;
  if (uVar27 == 0) {
switchD_00102cd9_caseD_5:
    iVar4 = iVar20;
LAB_0010343c:
    local_15d8 = *(char **)local_15b8;
    local_15b8 = (char *)((long)local_15b8 + 8);
    uVar27 = 0;
    iVar20 = iVar4;
    goto LAB_00103459;
  }
  if (uVar27 != 0x16) goto LAB_00103459;
LAB_001033e9:
  if (dVar22 == -NAN) {
    dVar22 = 4.94065645841247e-324;
  }
  lVar24 = 0x144;
  if (unaff_R13 == (char **)0x0) {
    puVar10 = &local_1444;
  }
  else {
    do {
      lVar26 = lVar24;
      *(char *)((long)&local_1588 + lVar26) = local_15b0[(ulong)unaff_R13 % (ulong)local_15e0];
      lVar24 = lVar26 + -1;
      bVar28 = local_15e0 <= unaff_R13;
      unaff_R13 = (char **)((ulong)unaff_R13 / (ulong)local_15e0);
    } while (bVar28);
    puVar10 = (undefined1 *)((long)&uStack_1590 + lVar26 + 7);
  }
  lVar19 = (long)dVar17 - (0x144 - lVar24);
  sVar9 = (long)dVar22 - (0x144 - lVar24);
  lVar26 = lVar24;
  if (((uVar23 != 0) && (local_15e0 == (char **)0x8)) && ((long)sVar9 < 1)) {
    *puVar10 = 0x30;
    lVar19 = lVar19 + -1;
    lVar26 = lVar24 + -1;
  }
  if (0 < (long)sVar9) {
    lVar26 = lVar26 - ((long)dVar22 + lVar24);
    memset(local_1443 + lVar26,0x30,sVar9);
    lVar19 = lVar19 - sVar9;
    lVar26 = lVar26 + 0x144;
  }
  bVar2 = local_15e0 == (char **)0x10 & (byte)uVar23;
  lVar24 = lVar19 + -2;
  if (bVar2 == 0) {
    lVar24 = lVar19;
  }
  if (((int)local_15e8 != 0) || ((*(byte *)(&uStack_1434 + (long)dVar15 * 8) & 3) != 0)) {
    lVar24 = lVar24 + -1;
  }
  if ((*(ushort *)(&uStack_1434 + (long)dVar15 * 8) & 0x104) == 0) {
    if (lVar24 < 1) {
      lVar24 = lVar24 + -1;
    }
    else {
      iVar4 = (int)lVar24 + iVar20;
      do {
        iVar5 = (*stream)(0x20,(FILE *)data);
        if (iVar5 == -1) goto LAB_001035f9;
        iVar20 = iVar20 + 1;
        lVar19 = lVar24 + -1;
        bVar28 = 0 < lVar24;
        lVar24 = lVar19;
      } while (lVar19 != 0 && bVar28);
      lVar24 = -1;
      iVar20 = iVar4;
    }
  }
  if ((int)local_15e8 == 0) {
    if (((&uStack_1434)[(long)dVar15 * 8] & 2) == 0) {
      if (((&uStack_1434)[(long)dVar15 * 8] & 1) != 0) {
        iVar4 = 0x20;
        goto LAB_00103592;
      }
      goto LAB_001035a5;
    }
    iVar4 = 0x2b;
LAB_00103592:
    iVar4 = (*stream)(iVar4,(FILE *)data);
    if (iVar4 != -1) goto LAB_0010359e;
    local_15e8 = (undefined8 *)0x0;
LAB_001035f9:
    unaff_R13 = (char **)0x0;
    iVar5 = iVar20;
  }
  else {
    iVar4 = (*stream)(0x2d,(FILE *)data);
    if (iVar4 == -1) {
      local_15e8 = (undefined8 *)0x1;
      goto LAB_001035f9;
    }
LAB_0010359e:
    iVar20 = iVar20 + 1;
LAB_001035a5:
    if (bVar2 == 0) {
LAB_00103626:
      if (((&uStack_1434)[(long)dVar15 * 8] & 0x104) == 0x100) {
        if (lVar24 < 1) {
          lVar24 = lVar24 + -1;
        }
        else {
          iVar4 = (int)lVar24 + iVar20;
          do {
            iVar5 = (*stream)(0x30,(FILE *)data);
            if (iVar5 == -1) goto LAB_001035f9;
            iVar20 = iVar20 + 1;
            lVar8 = lVar24 + -1;
            bVar28 = 0 < lVar24;
            lVar24 = lVar8;
          } while (lVar8 != 0 && bVar28);
          lVar24 = -1;
          iVar20 = iVar4;
        }
      }
      if (lVar26 < 0x144) {
        lVar26 = lVar26 + -1;
        do {
          iVar4 = (*stream)((int)*(undefined1 *)((long)&local_1588 + lVar26 + 2),(FILE *)data);
          if (iVar4 == -1) goto LAB_001035f9;
          iVar20 = iVar20 + 1;
          lVar26 = lVar26 + 1;
        } while (lVar26 < 0x143);
      }
      iVar4 = iVar20;
      if (((*(byte *)(&uStack_1434 + (long)dVar15 * 8) & 4) != 0) && (0 < lVar24)) {
        iVar4 = (int)lVar24 + iVar20;
        lVar24 = lVar24 + 1;
        do {
          iVar5 = (*stream)(0x20,(FILE *)data);
          if (iVar5 == -1) goto LAB_001035f9;
          iVar20 = iVar20 + 1;
          lVar24 = lVar24 + -1;
        } while (1 < lVar24);
      }
      unaff_R13 = (char **)0x0;
      goto LAB_0010343c;
    }
    iVar4 = (*stream)(0x30,(FILE *)data);
    if (iVar4 == -1) {
      local_15e0 = (char **)0x10;
      goto LAB_001035f9;
    }
    iVar5 = iVar20 + 1;
    if ((*(byte *)((long)&uStack_1434 + lVar8 + 1) & 0x10) == 0) {
      iVar4 = 0x78;
    }
    else {
      iVar4 = 0x58;
    }
    iVar4 = (*stream)(iVar4,(FILE *)data);
    if (iVar4 != -1) {
      iVar20 = iVar20 + 2;
      goto LAB_00103626;
    }
    local_15e0 = (char **)0x10;
    unaff_R13 = (char **)0x0;
  }
LAB_00103600:
  uVar27 = 1;
  iVar20 = iVar5;
  local_1600 = iVar5;
LAB_00103459:
  if ((uVar27 & 0x1d) != 0) {
    return local_1600;
  }
  goto LAB_00102b78;
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num = 0; /* parameter counter */

  va_stack_t vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;

  char work[BUFFSIZE];

  va_stack_t *p;

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (false?) warning Coverity gives us
     otherwise */
  char *workend = &work[sizeof(work) - 2];

  /* Do the actual %-code parsing */
  if(dprintf_Pass1(format, vto, endpos, ap_save))
    return -1;

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    unsigned long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    char *w;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param = dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM) {
      width = (long)vto[p->width].data.num.as_signed;
      param_num++; /* since the width is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        width = -width;
        p->flags |= FLAGS_LEFT;
        p->flags &= ~FLAGS_PAD_NIL;
      }
    }
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch(p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */

      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      while(num > 0) {
        *w-- = digits[num % base];
        num /= base;
      }
      width -= (long)(workend - w);
      prec -= (long)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
        --width;

      if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(p->flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(p->flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(p->flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(p->flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(str == NULL) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else if(prec != -1)
          len = (size_t)prec;
        else
          len = strlen(str);

        width -= (len > LONG_MAX) ? LONG_MAX : (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        for(; len && *str; len--)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr != NULL) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(! (p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr = &formatbuf[1];
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          *fptr++ = '-';
        if(p->flags & FLAGS_SHOWSIGN)
          *fptr++ = '+';
        if(p->flags & FLAGS_SPACE)
          *fptr++ = ' ';
        if(p->flags & FLAGS_ALT)
          *fptr++ = '#';

        *fptr = 0;

        if(width >= 0) {
          if(width >= (long)sizeof(work))
            width = sizeof(work)-1;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* for each digit in the integer part, we can have one less
             precision */
          size_t maxprec = sizeof(work) - 2;
          double val = p->data.dnum;
          while(val >= 10.0) {
            val /= 10;
            maxprec--;
          }

          if(prec > (long)maxprec)
            prec = (long)maxprec-1;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final zero termination */

        /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
           output characters */
        (sprintf)(work, formatbuf, p->data.dnum);
        DEBUGASSERT(strlen(work) <= sizeof(work));
        for(fptr = work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}